

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryObject.cpp
# Opt level: O3

void __thiscall
chatra::TemporaryObject::selectElement(TemporaryObject *this,Node *node,StringId name)

{
  Type TVar1;
  ReferenceNode *pRVar2;
  Thread *pTVar3;
  undefined8 *puVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  string local_40;
  
  TVar1 = this->type;
  if ((TVar1 == Rvalue) && (((this->targetRef).node)->type != Object)) {
    pTVar3 = this->thread;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"invalid suffix or element selection on primitive","");
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    errorAtNode(&pTVar3->super_IErrorReceiver,Error,node,&local_40,&local_58);
  }
  else if (name - Self < 2) {
    pTVar3 = this->thread;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"cannot access \"self\" or \"super\" from outside class","");
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    errorAtNode(&pTVar3->super_IErrorReceiver,Error,node,&local_40,&local_58);
  }
  else {
    if (((TVar1 & ~Rvalue) != ScopeRef) || (((this->targetRef).node)->type == Object)) {
      if ((((0x1f02U >> (TVar1 & 0x1f) & 1) == 0) ||
          (pRVar2 = (this->targetRef).node, pRVar2->type != Object)) ||
         (pRVar2->object != (Object *)0x0)) {
        if (node != (Node *)0x0) {
          this->node = node;
        }
        this->name = name;
        this->hasName = true;
        return;
      }
      pTVar3 = this->thread;
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"de-referencing null","");
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      errorAtNode(&pTVar3->super_IErrorReceiver,Error,node,&local_40,&local_58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_58);
      std::__cxx11::string::~string((string *)&local_40);
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = &PTR__exception_00243b18;
      *(undefined4 *)(puVar4 + 1) = 0x89;
      goto LAB_0014e7ba;
    }
    pTVar3 = this->thread;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"base type of element selection is not object","");
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    errorAtNode(&pTVar3->super_IErrorReceiver,Error,node,&local_40,&local_58);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  std::__cxx11::string::~string((string *)&local_40);
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar4 = &PTR__exception_00243b18;
  *(undefined4 *)(puVar4 + 1) = 0x83;
LAB_0014e7ba:
  __cxa_throw(puVar4,&RuntimeException::typeinfo,std::exception::~exception);
}

Assistant:

void TemporaryObject::selectElement(Node* node, StringId name) {
	chatra_assert(!requiresEvaluate());
	chatra_assert(!hasArgs && !hasSetArg);
	chatra_assert(type != Type::Empty);
	chatra_assert(!hasMethods());

	if (type == Type::Rvalue && targetRef.valueType() != ReferenceValueType::Object) {
		errorAtNode(thread, ErrorLevel::Error, node, "invalid suffix or element selection on primitive", {});
		throw RuntimeException(StringId::UnsupportedOperationException);
	}
	if (name == StringId::Self || name == StringId::Super) {
		errorAtNode(thread, ErrorLevel::Error, node, R"(cannot access "self" or "super" from outside class)", {});
		throw RuntimeException(StringId::UnsupportedOperationException);
	}
	if ((type == Type::ScopeRef || type == Type::ObjectRef) && targetRef.valueType() != ReferenceValueType::Object) {
		errorAtNode(thread, ErrorLevel::Error, node, "base type of element selection is not object", {});
		throw RuntimeException(StringId::UnsupportedOperationException);
	}
	if (hasRef() && targetRef.isNull()) {
		errorAtNode(thread, ErrorLevel::Error, node, "de-referencing null", {});
		throw RuntimeException(StringId::NullReferenceException);
	}

	if (node != nullptr)
		this->node = node;
	this->name = name;
	hasName = true;
}